

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void var_new(LexState *ls,BCReg n,GCstr *name)

{
  VarInfo *pVVar1;
  void *in_RDX;
  int in_ESI;
  LexState *in_RDI;
  MSize vtop;
  FuncState *fs;
  MSize in_stack_ffffffffffffffd8;
  uint lim;
  FuncState *fs_00;
  undefined4 in_stack_fffffffffffffff0;
  
  fs_00 = in_RDI->fs;
  lim = in_RDI->vtop;
  if (199 < fs_00->nactvar + in_ESI) {
    err_limit(fs_00,lim,(char *)0x1539e7);
  }
  if (in_RDI->sizevstack <= lim) {
    if (0xffc3 < in_RDI->sizevstack) {
      lj_lex_error(in_RDI,0,LJ_ERR_XLIMC,0xffc4);
    }
    pVVar1 = (VarInfo *)
             lj_mem_grow((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                         (MSize *)fs_00,lim,in_stack_ffffffffffffffd8);
    in_RDI->vstack = pVVar1;
  }
  in_RDI->vstack[lim].name.gcptr32 = (uint32_t)in_RDX;
  fs_00->varmap[fs_00->nactvar + in_ESI] = (VarIndex)lim;
  in_RDI->vtop = lim + 1;
  return;
}

Assistant:

static void var_new(LexState *ls, BCReg n, GCstr *name)
{
  FuncState *fs = ls->fs;
  MSize vtop = ls->vtop;
  checklimit(fs, fs->nactvar+n, LJ_MAX_LOCVAR, "local variables");
  if (LJ_UNLIKELY(vtop >= ls->sizevstack)) {
    if (ls->sizevstack >= LJ_MAX_VSTACK)
      lj_lex_error(ls, 0, LJ_ERR_XLIMC, LJ_MAX_VSTACK);
    lj_mem_growvec(ls->L, ls->vstack, ls->sizevstack, LJ_MAX_VSTACK, VarInfo);
  }
  lj_assertFS((uintptr_t)name < VARNAME__MAX ||
	      lj_tab_getstr(fs->kt, name) != NULL,
	      "unanchored variable name");
  /* NOBARRIER: name is anchored in fs->kt and ls->vstack is not a GCobj. */
  setgcref(ls->vstack[vtop].name, obj2gco(name));
  fs->varmap[fs->nactvar+n] = (uint16_t)vtop;
  ls->vtop = vtop+1;
}